

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l0x.cpp
# Opt level: O1

void __thiscall VL53L0X::stopContinuous(VL53L0X *this)

{
  writeRegister(this,'\0','\x01');
  writeRegister(this,0xff,'\x01');
  writeRegister(this,'\0','\0');
  writeRegister(this,0x91,'\0');
  writeRegister(this,'\0','\x01');
  writeRegister(this,0xff,'\0');
  return;
}

Assistant:

void VL53L0X::stopContinuous() {
	// VL53L0X_REG_SYSRANGE_MODE_SINGLESHOT
	this->writeRegister(SYSRANGE_START, 0x01);

	this->writeRegister(0xFF, 0x01);
	this->writeRegister(0x00, 0x00);
	this->writeRegister(0x91, 0x00);
	this->writeRegister(0x00, 0x01);
	this->writeRegister(0xFF, 0x00);
}